

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::BindOnConflictClause
          (Binder *this,LogicalInsert *insert,TableCatalogEntry *table,InsertStatement *stmt)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> __ptr;
  pointer puVar2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  pointer pBVar8;
  pointer this_00;
  BaseTableRef *pBVar9;
  type pOVar10;
  reference pvVar11;
  mapped_type *pmVar12;
  LogicalIndex logical;
  ColumnDefinition *pCVar13;
  ColumnList *pCVar14;
  ulong uVar15;
  size_type sVar16;
  string *psVar17;
  iterator iVar18;
  long lVar19;
  idx_t iVar20;
  LogicalType *__x;
  reference this_01;
  pointer pLVar21;
  reference pvVar22;
  type pEVar23;
  idx_t iVar24;
  pointer pUVar25;
  TableBinding *pTVar26;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  InternalException *this_02;
  BinderException *pBVar27;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_03;
  bool bVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_04;
  byte bVar30;
  size_type __n;
  Binder *pBVar31;
  IndexInfo *index_1;
  DummyBinding *pDVar32;
  element_type *peVar33;
  IndexInfo *index;
  pointer pCVar34;
  __hashtable *__h;
  pointer pCVar35;
  ColumnListIterator CVar36;
  optional_ptr<duckdb::Binding,_true> original_binding;
  optional_idx projection_index;
  ColumnLogicalIteratorInternal __begin2;
  ErrorData unused;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition_1;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> bound_table;
  vector<duckdb::LogicalType,_true> table_column_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  table_column_names;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  TableStorageInfo storage_info;
  optional_ptr<duckdb::Binding,_true> local_210;
  optional_idx local_208;
  string *local_200;
  undefined1 local_1f8 [8];
  pointer puStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [6];
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  undefined1 local_170 [8];
  undefined1 auStack_168 [32];
  undefined1 local_148 [72];
  TableCatalogEntry *local_100;
  ColumnList *local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  optional_ptr<duckdb::DummyBinding,_true> oStack_d0;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b8;
  undefined1 local_98 [16];
  element_type *local_88;
  TableStorageInfo local_80;
  Binder *local_60;
  ClientContext *local_58;
  string local_50;
  
  if ((stmt->on_conflict_info).
      super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>
      .super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl == (OnConflictInfo *)0x0)
  {
    insert->action_type = THROW;
    return;
  }
  local_f0._8_8_ = stmt;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            (&stmt->table_ref);
  Bind((Binder *)local_e0,(TableRef *)this);
  pBVar8 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                       *)local_e0);
  if (pBVar8->type != BASE_TABLE) {
    pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
    local_180 = (undefined1  [8])local_170;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"Can only update base table!","");
    BinderException::BinderException(pBVar27,(string *)local_180);
    __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                      (&stmt->table_ref);
  pBVar9 = TableRef::Cast<duckdb::BaseTableRef>(this_00);
  local_200 = &pBVar9->table_name;
  if ((pBVar9->super_TableRef).alias._M_string_length != 0) {
    local_200 = &(pBVar9->super_TableRef).alias;
  }
  pOVar10 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
            operator*((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                       *)(local_f0._8_8_ + 0x110));
  insert->action_type = pOVar10->action_type;
  (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x17])
            (&local_80,table,this->context);
  local_f8 = TableCatalogEntry::GetColumns(table);
  local_100 = table;
  if ((pOVar10->indexed_columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pOVar10->indexed_columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_180 = (undefined1  [8])(auStack_168 + 0x18);
    local_178._M_p = &DAT_00000001;
    local_170 = (undefined1  [8])0x0;
    auStack_168._0_8_ = (pointer)0x0;
    auStack_168._8_4_ = 0x3f800000;
    auStack_168._16_8_ = (vector<duckdb::DummyBinding,_true> *)0x0;
    auStack_168._24_8_ = 0;
    if ((pOVar10->indexed_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pOVar10->indexed_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&pOVar10->indexed_columns,__n);
        pmVar12 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_180,pvVar11);
        *pmVar12 = __n;
        pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&pOVar10->indexed_columns,__n);
        logical = TableCatalogEntry::GetColumnIndex(table,pvVar11,false);
        if (logical.index == 0xffffffffffffffff) {
          pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8 = (undefined1  [8])local_1e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"Cannot specify ROWID as ON CONFLICT target","");
          BinderException::BinderException(pBVar27,(string *)local_1f8);
          __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pCVar13 = ColumnList::GetColumn(local_f8,logical);
        bVar6 = ColumnDefinition::Generated(pCVar13);
        if (bVar6) {
          pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8 = (undefined1  [8])local_1e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"Cannot specify a generated column as ON CONFLICT target",
                     "");
          BinderException::BinderException(pBVar27,(string *)local_1f8);
          __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(pOVar10->indexed_columns).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pOVar10->indexed_columns).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    CVar36 = ColumnList::Physical(local_f8);
    pCVar14 = CVar36.list;
    if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_1e8[0]._8_8_ =
           ((long)(pCVar14->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    *)&(pCVar14->columns).
                       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       .
                       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                  super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> >> 3) *
           -0x7b425ed097b425ed;
    }
    else {
      local_1e8[0]._8_8_ =
           (long)(pCVar14->physical_columns).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pCVar14->physical_columns).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
    }
    puStack_1f0 = (pointer)CONCAT71(puStack_1f0._1_7_,CVar36.physical);
    local_1e8[0]._M_allocated_capacity = (element_type *)0x0;
    if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      peVar33 = (element_type *)
                (((long)(pCVar14->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          *)&(pCVar14->columns).
                             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                             .
                             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                        super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> >> 3) *
                -0x7b425ed097b425ed);
    }
    else {
      peVar33 = (element_type *)
                ((long)(pCVar14->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar14->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
    }
    if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((long)(pCVar14->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          *)&(pCVar14->columns).
                             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                             .
                             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                        super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> >> 3) *
                -0x7b425ed097b425ed);
    }
    else {
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)(pCVar14->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar14->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
    }
    local_1f8 = (undefined1  [8])pCVar14;
    if ((peVar33 != (element_type *)0x0) ||
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8[0]._8_8_ != p_Var29)) {
      do {
        pCVar13 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_1f8);
        psVar17 = ColumnDefinition::Name_abi_cxx11_(pCVar13);
        iVar18 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_180,psVar17);
        if (iVar18.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_e0._8_8_ = ColumnDefinition::Physical(pCVar13);
          local_b8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&insert->on_conflict_filter;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&insert->on_conflict_filter,local_e0 + 8,&local_b8);
        }
        local_1e8[0]._0_8_ = local_1e8[0]._M_allocated_capacity + 1;
      } while ((((element_type *)local_1e8[0]._0_8_ != peVar33) ||
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8[0]._8_8_ != p_Var29)) ||
              (local_1f8 != (undefined1  [8])pCVar14));
    }
    if (local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
        super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
        super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar28 = false;
      bVar6 = false;
      pDVar32 = (DummyBinding *)
                local_80.index_info.
                super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
                super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        lVar19 = 0;
        if (*(bool *)&(pDVar32->super_Binding)._vptr_Binding == true) {
          bVar7 = ::std::__detail::
                  _Equality<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  ::_M_equal((_Equality<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                              *)&insert->on_conflict_filter,
                             (__hashtable *)&(pDVar32->super_Binding).binding_type);
          lVar19 = 0;
          bVar6 = bVar28;
          if (bVar7) {
            lVar19 = 7;
            bVar28 = true;
            bVar6 = true;
          }
        }
      } while ((lVar19 == 0) &&
              (pDVar32 = (DummyBinding *)&(pDVar32->super_Binding).alias.schema.field_2,
              pDVar32 !=
              (DummyBinding *)
              local_80.index_info.
              super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
              super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
              super__Vector_impl_data._M_finish));
      if (bVar6) {
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_180);
        goto LAB_011e5ee4;
      }
    }
    pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
    local_1f8 = (undefined1  [8])local_1e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "The specified columns as conflict target are not referenced by a UNIQUE/PRIMARY KEY CONSTRAINT or INDEX"
               ,"");
    BinderException::BinderException(pBVar27,(string *)local_1f8);
    __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_58 = (ClientContext *)
             local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>
             .super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pBVar31 = (Binder *)0x0;
  pDVar32 = (DummyBinding *)
            local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
            super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
      super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_80.index_info.super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
      super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*(bool *)&(pDVar32->super_Binding)._vptr_Binding == true) {
        pCVar14 = TableCatalogEntry::GetColumns(local_100);
        CVar36 = ColumnList::Physical(pCVar14);
        pCVar14 = CVar36.list;
        if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          auStack_168._0_8_ =
               ((long)(pCVar14->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar14->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        }
        else {
          auStack_168._0_8_ =
               (long)(pCVar14->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pCVar14->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
        }
        local_178._M_p._0_1_ = CVar36.physical;
        local_170 = (undefined1  [8])0x0;
        if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar34 = (pointer)(((long)(pCVar14->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar14->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7b425ed097b425ed);
        }
        else {
          pCVar34 = (pointer)((long)(pCVar14->physical_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pCVar14->physical_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar35 = (pointer)(((long)(pCVar14->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar14->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7b425ed097b425ed);
        }
        else {
          pCVar35 = (pointer)((long)(pCVar14->physical_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pCVar14->physical_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        local_180 = (undefined1  [8])pCVar14;
        if ((pCVar34 == (pointer)0x0) && ((pointer)auStack_168._0_8_ == pCVar35)) {
          uVar15 = 0;
        }
        else {
          bVar30 = 0;
          local_60 = pBVar31;
          do {
            pCVar13 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                                ((ColumnLogicalIteratorInternal *)local_180);
            local_1f8 = (undefined1  [8])ColumnDefinition::Physical(pCVar13);
            sVar16 = ::std::
                     _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&(pDVar32->super_Binding).binding_type,(key_type *)local_1f8);
            if (sVar16 != 0) {
              bVar30 = 1;
              break;
            }
            local_170 = (undefined1  [8])((long)local_170 + 1);
          } while (((local_170 != (undefined1  [8])pCVar34) ||
                   ((pointer)auStack_168._0_8_ != pCVar35)) ||
                  (local_180 != (undefined1  [8])pCVar14));
          uVar15 = (ulong)bVar30;
          pBVar31 = local_60;
        }
        pBVar31 = (Binder *)
                  ((long)&(pBVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                          internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + uVar15);
      }
      pDVar32 = (DummyBinding *)&(pDVar32->super_Binding).alias.schema.field_2;
    } while ((ClientContext *)pDVar32 != local_58);
  }
  if (pBVar31 != (Binder *)&DAT_00000001) {
    if (pBVar31 == (Binder *)0x0) {
      pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180 = (undefined1  [8])local_170;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "There are no UNIQUE/PRIMARY KEY Indexes that refer to this table, ON CONFLICT is a no-op"
                 ,"");
      BinderException::BinderException(pBVar27,(string *)local_180);
      __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (insert->action_type != NOTHING) {
      pBVar27 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180 = (undefined1  [8])local_170;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "Conflict target has to be provided for a DO UPDATE operation when the table has multiple UNIQUE/PRIMARY KEY constraints"
                 ,"");
      BinderException::BinderException(pBVar27,(string *)local_180);
      __cxa_throw(pBVar27,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_011e5ee4:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"excluded","");
  AddTableName(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar20 = GenerateTableIndex(this);
  insert->excluded_table_index = iVar20;
  local_b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
  local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oStack_d0.ptr = (DummyBinding *)0x0;
  CVar36 = ColumnList::Physical(local_f8);
  pCVar14 = CVar36.list;
  if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    auStack_168._0_8_ =
         ((long)(pCVar14->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar14->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    auStack_168._0_8_ =
         (long)(pCVar14->physical_columns).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pCVar14->physical_columns).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
  }
  local_178._M_p._0_1_ = CVar36.physical;
  local_170 = (undefined1  [8])0x0;
  if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar34 = (pointer)(((long)(pCVar14->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar14->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed
                       );
  }
  else {
    pCVar34 = (pointer)((long)(pCVar14->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar14->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  if (((undefined1  [16])CVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar35 = (pointer)(((long)(pCVar14->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar14->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed
                       );
  }
  else {
    pCVar35 = (pointer)((long)(pCVar14->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar14->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  local_180 = (undefined1  [8])pCVar14;
  if ((pCVar34 != (pointer)0x0) || ((pointer)auStack_168._0_8_ != pCVar35)) {
    do {
      do {
        pCVar13 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_180);
        psVar17 = ColumnDefinition::Name_abi_cxx11_(pCVar13);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_b8,psVar17);
        __x = ColumnDefinition::Type(pCVar13);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_e0 + 8),__x);
        local_170 = (undefined1  [8])((long)local_170 + 1);
      } while (local_170 != (undefined1  [8])pCVar34);
    } while (((pointer)auStack_168._0_8_ != pCVar35) || (local_180 != (undefined1  [8])pCVar14));
  }
  local_180 = (undefined1  [8])local_170;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"excluded","");
  BindContext::AddGenericBinding
            (&this->bind_context,iVar20,(string *)local_180,&local_b8,
             (vector<duckdb::LogicalType,_true> *)(local_e0 + 8));
  if (local_180 != (undefined1  [8])local_170) {
    operator_delete((void *)local_180);
  }
  if ((pOVar10->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    WhereBinder::WhereBinder
              ((WhereBinder *)local_180,this,this->context,
               (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
    local_1f8 = (undefined1  [8])0x0;
    puStack_1f0 = (pointer)0x0;
    local_1e8[0]._M_allocated_capacity = (element_type *)0x0;
    ExpressionBinder::DoUpdateSetQualify
              ((ExpressionBinder *)local_180,&pOVar10->condition,local_200,
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *)local_1f8);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_98,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_180,(optional_ptr<duckdb::LogicalType,_true>)&pOVar10->condition,false);
    uVar5 = local_98._0_8_;
    local_98._0_8_ = (Expression *)0x0;
    _Var1._M_head_impl =
         (insert->on_conflict_condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (insert->on_conflict_condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar5;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((Expression *)local_98._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_98._0_8_)->_vptr_BaseExpression[1])();
    }
    ::std::
    vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_1f8);
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_180);
  }
  local_208.index = 0xffffffffffffffff;
  if ((insert->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (insert->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_04 = &(insert->super_LogicalOperator).children;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](this_04,0);
      pLVar21 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_01);
      (*pLVar21->_vptr_LogicalOperator[0xd])((vector<unsigned_long,_true> *)local_180);
      if (local_180 == (undefined1  [8])local_178._M_p) {
        pLVar21 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(this_01);
        this_04 = &pLVar21->children;
      }
      else {
        pvVar22 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_180,0);
        optional_idx::optional_idx((optional_idx *)local_1f8,*pvVar22);
        local_208.index = (idx_t)local_1f8;
      }
      if (local_180 != (undefined1  [8])0x0) {
        operator_delete((void *)local_180);
      }
      if ((ColumnList *)local_208.index != (ColumnList *)0xffffffffffffffff) {
        ErrorData::ErrorData((ErrorData *)local_180);
        local_210 = BindContext::GetBinding(&this->bind_context,local_200,(ErrorData *)local_180);
        optional_ptr<duckdb::Binding,_true>::CheckValid(&local_210);
        iVar20 = (local_210.ptr)->index;
        if ((insert->on_conflict_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(&insert->on_conflict_condition);
          iVar24 = optional_idx::GetIndex(&local_208);
          ReplaceColumnBindings(pEVar23,iVar20,iVar24);
        }
        if (insert->action_type == REPLACE) {
          CreateSetInfoForReplace
                    ((duckdb *)local_1f8,local_100,(InsertStatement *)local_f0._8_8_,&local_80);
          auVar4 = local_1f8;
          local_1f8 = (undefined1  [8])0x0;
          __ptr._M_head_impl =
               (pOVar10->set_info).
               super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>
               .super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl;
          (pOVar10->set_info).
          super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>
          .super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl =
               (UpdateSetInfo *)auVar4;
          if (__ptr._M_head_impl != (UpdateSetInfo *)0x0) {
            ::std::default_delete<duckdb::UpdateSetInfo>::operator()
                      ((default_delete<duckdb::UpdateSetInfo> *)&pOVar10->set_info,
                       __ptr._M_head_impl);
          }
          if (local_1f8 != (undefined1  [8])0x0) {
            ::std::default_delete<duckdb::UpdateSetInfo>::operator()
                      ((default_delete<duckdb::UpdateSetInfo> *)local_1f8,(UpdateSetInfo *)local_1f8
                      );
          }
          insert->action_type = UPDATE;
        }
        if (((pOVar10->set_info).
             super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>
             .super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl !=
             (UpdateSetInfo *)0x0) &&
           (pUVar25 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                      ::operator->(&pOVar10->set_info),
           (pUVar25->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (pUVar25->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          insert->action_type = NOTHING;
        }
        if (insert->action_type == NOTHING) {
          if ((insert->on_conflict_condition).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
          {
            optional_ptr<duckdb::Binding,_true>::CheckValid(&local_210);
            pTVar26 = Binding::Cast<duckdb::TableBinding>(local_210.ptr);
            GetColumnsToFetch((vector<unsigned_long,_true> *)local_1f8,pTVar26);
            puVar2 = (insert->columns_to_fetch).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1f8;
            (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)puStack_1f0;
            (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_1e8[0]._0_8_;
            local_1f8 = (undefined1  [8])0x0;
            puStack_1f0 = (pointer)0x0;
            local_1e8[0]._M_allocated_capacity = (element_type *)0x0;
            if (puVar2 != (pointer)0x0) {
              operator_delete(puVar2);
            }
            if (local_1f8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1f8);
            }
          }
        }
        else {
          result_type.ptr =
               (LogicalType *)
               unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
               operator*(&pOVar10->set_info);
          lVar19._0_1_ = (result_type.ptr)->id_;
          lVar19._1_1_ = (result_type.ptr)->physical_type_;
          lVar19._2_6_ = *(undefined6 *)&(result_type.ptr)->field_0x2;
          if (lVar19 != 0) {
            WhereBinder::WhereBinder
                      ((WhereBinder *)local_1f8,this,this->context,
                       (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
            local_98._0_8_ = (Expression *)0x0;
            local_98._8_8_ = (pointer)0x0;
            local_88 = (element_type *)0x0;
            ExpressionBinder::DoUpdateSetQualify
                      ((ExpressionBinder *)local_1f8,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)result_type.ptr,local_200,
                       (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                        *)local_98);
            ExpressionBinder::Bind
                      ((ExpressionBinder *)local_f0,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_1f8,result_type,false);
            uVar5 = local_f0._0_8_;
            local_f0._0_8_ = (Expression *)0x0;
            _Var1._M_head_impl =
                 (insert->do_update_condition).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (insert->do_update_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar5;
            if (_Var1._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((Expression *)local_f0._0_8_ != (Expression *)0x0) {
              (*((BaseExpression *)local_f0._0_8_)->_vptr_BaseExpression[1])();
            }
            ::std::
            vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector((vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_98);
            ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_1f8);
          }
          BindDoUpdateSetExpressions
                    (this,local_200,insert,(UpdateSetInfo *)result_type.ptr,local_100,&local_80);
          optional_ptr<duckdb::Binding,_true>::CheckValid(&local_210);
          pTVar26 = Binding::Cast<duckdb::TableBinding>(local_210.ptr);
          GetColumnsToFetch((vector<unsigned_long,_true> *)local_1f8,pTVar26);
          puVar2 = (insert->columns_to_fetch).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1f8;
          (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puStack_1f0;
          (insert->columns_to_fetch).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_1e8[0]._0_8_;
          local_1f8 = (undefined1  [8])0x0;
          puStack_1f0 = (pointer)0x0;
          local_1e8[0]._M_allocated_capacity = (element_type *)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          if (local_1f8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1f8);
          }
          this_03 = (insert->super_LogicalOperator).expressions.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = (insert->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (this_03 != puVar3) {
            do {
              pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator*(this_03);
              iVar24 = optional_idx::GetIndex(&local_208);
              ReplaceColumnBindings(pEVar23,iVar20,iVar24);
              this_03 = this_03 + 1;
            } while (this_03 != puVar3);
          }
          if ((insert->do_update_condition).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
          {
            pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(&insert->do_update_condition);
            iVar24 = optional_idx::GetIndex(&local_208);
            ReplaceColumnBindings(pEVar23,iVar20,iVar24);
          }
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_148 + 0x10));
        if ((vector<duckdb::DummyBinding,_true> *)auStack_168._16_8_ !=
            (vector<duckdb::DummyBinding,_true> *)local_148) {
          operator_delete((void *)auStack_168._16_8_);
        }
        if ((ColumnList *)local_178._M_p != (ColumnList *)(local_170 + 8)) {
          operator_delete(local_178._M_p);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_e0 + 8));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8);
        ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::~vector
                  (&local_80.index_info.
                    super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>);
        if ((element_type *)local_e0._0_8_ == (element_type *)0x0) {
          return;
        }
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_e0._0_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
        return;
      }
    } while ((this_04->
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this_04->
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_180 = (undefined1  [8])local_170;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"Could not locate a table_index from the children of the insert",""
            );
  InternalException::InternalException(this_02,(string *)local_180);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::BindOnConflictClause(LogicalInsert &insert, TableCatalogEntry &table, InsertStatement &stmt) {
	if (!stmt.on_conflict_info) {
		insert.action_type = OnConflictAction::THROW;
		return;
	}
	D_ASSERT(stmt.table_ref->type == TableReferenceType::BASE_TABLE);

	// visit the table reference
	auto bound_table = Bind(*stmt.table_ref);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("Can only update base table!");
	}

	auto &table_ref = stmt.table_ref->Cast<BaseTableRef>();
	const string &table_alias = !table_ref.alias.empty() ? table_ref.alias : table_ref.table_name;

	auto &on_conflict = *stmt.on_conflict_info;
	D_ASSERT(on_conflict.action_type != OnConflictAction::THROW);
	insert.action_type = on_conflict.action_type;

	// obtain the table storage info
	auto storage_info = table.GetStorageInfo(context);

	auto &columns = table.GetColumns();
	if (!on_conflict.indexed_columns.empty()) {
		// Bind the ON CONFLICT (<columns>)

		// create a mapping of (list index) -> (column index)
		case_insensitive_map_t<idx_t> specified_columns;
		for (idx_t i = 0; i < on_conflict.indexed_columns.size(); i++) {
			specified_columns[on_conflict.indexed_columns[i]] = i;
			auto column_index = table.GetColumnIndex(on_conflict.indexed_columns[i]);
			if (column_index.index == COLUMN_IDENTIFIER_ROW_ID) {
				throw BinderException("Cannot specify ROWID as ON CONFLICT target");
			}
			auto &col = columns.GetColumn(column_index);
			if (col.Generated()) {
				throw BinderException("Cannot specify a generated column as ON CONFLICT target");
			}
		}
		for (auto &col : columns.Physical()) {
			auto entry = specified_columns.find(col.Name());
			if (entry != specified_columns.end()) {
				// column was specified, set to the index
				insert.on_conflict_filter.insert(col.Physical().index);
			}
		}
		bool index_references_columns = false;
		for (auto &index : storage_info.index_info) {
			if (!index.is_unique) {
				continue;
			}
			bool index_matches = insert.on_conflict_filter == index.column_set;
			if (index_matches) {
				index_references_columns = true;
				break;
			}
		}
		if (!index_references_columns) {
			// Same as before, this is essentially a no-op, turning this into a DO THROW instead
			// But since this makes no logical sense, it's probably better to throw an error
			throw BinderException("The specified columns as conflict target are not referenced by a UNIQUE/PRIMARY KEY "
			                      "CONSTRAINT or INDEX");
		}
	} else {
		// When omitting the conflict target, the ON CONFLICT applies to every UNIQUE/PRIMARY KEY on the table

		// We check if there are any constraints on the table, if there aren't we throw an error.
		idx_t found_matching_indexes = 0;
		for (auto &index : storage_info.index_info) {
			if (!index.is_unique) {
				continue;
			}
			auto &indexed_columns = index.column_set;
			bool matches = false;
			for (auto &column : table.GetColumns().Physical()) {
				if (indexed_columns.count(column.Physical().index)) {
					matches = true;
					break;
				}
			}
			found_matching_indexes += matches;
		}

		if (!found_matching_indexes) {
			throw BinderException(
			    "There are no UNIQUE/PRIMARY KEY Indexes that refer to this table, ON CONFLICT is a no-op");
		} else if (found_matching_indexes != 1) {
			if (insert.action_type != OnConflictAction::NOTHING) {
				// When no conflict target is provided, and the action type is UPDATE,
				// we only allow the operation when only a single Index exists
				throw BinderException("Conflict target has to be provided for a DO UPDATE operation when the table has "
				                      "multiple UNIQUE/PRIMARY KEY constraints");
			}
		}
	}

	// add the 'excluded' dummy table binding
	AddTableName("excluded");
	// add a bind context entry for it
	auto excluded_index = GenerateTableIndex();
	insert.excluded_table_index = excluded_index;
	vector<string> table_column_names;
	vector<LogicalType> table_column_types;
	for (auto &col : columns.Physical()) {
		table_column_names.push_back(col.Name());
		table_column_types.push_back(col.Type());
	}
	bind_context.AddGenericBinding(excluded_index, "excluded", table_column_names, table_column_types);

	if (on_conflict.condition) {
		WhereBinder where_binder(*this, context);

		// Avoid ambiguity between existing table columns and EXCLUDED columns.
		vector<unordered_set<string>> lambda_params;
		where_binder.DoUpdateSetQualify(on_conflict.condition, table_alias, lambda_params);

		// Bind the ON CONFLICT ... WHERE clause.
		auto condition = where_binder.Bind(on_conflict.condition);
		insert.on_conflict_condition = std::move(condition);
	}

	optional_idx projection_index;
	reference<vector<unique_ptr<LogicalOperator>>> insert_child_operators = insert.children;
	while (!projection_index.IsValid()) {
		if (insert_child_operators.get().empty()) {
			// No further children to visit
			break;
		}
		auto &current_child = insert_child_operators.get()[0];
		auto table_indices = current_child->GetTableIndex();
		if (table_indices.empty()) {
			// This operator does not have a table index to refer to, we have to visit its children
			insert_child_operators = current_child->children;
			continue;
		}
		projection_index = table_indices[0];
	}
	if (!projection_index.IsValid()) {
		throw InternalException("Could not locate a table_index from the children of the insert");
	}

	ErrorData unused;
	auto original_binding = bind_context.GetBinding(table_alias, unused);
	D_ASSERT(original_binding && !unused.HasError());

	auto table_index = original_binding->index;

	// Replace any column bindings to refer to the projection table_index, rather than the source table
	if (insert.on_conflict_condition) {
		ReplaceColumnBindings(*insert.on_conflict_condition, table_index, projection_index.GetIndex());
	}

	if (insert.action_type == OnConflictAction::REPLACE) {
		D_ASSERT(on_conflict.set_info == nullptr);
		on_conflict.set_info = CreateSetInfoForReplace(table, stmt, storage_info);
		insert.action_type = OnConflictAction::UPDATE;
	}
	if (on_conflict.set_info && on_conflict.set_info->columns.empty()) {
		// if we are doing INSERT OR REPLACE on a table with no columns outside of the primary key column
		// convert to INSERT OR IGNORE
		insert.action_type = OnConflictAction::NOTHING;
	}
	if (insert.action_type == OnConflictAction::NOTHING) {
		if (!insert.on_conflict_condition) {
			return;
		}
		// Get the column_ids we need to fetch later on from the conflicting tuples
		// of the original table, to execute the expressions
		D_ASSERT(original_binding->binding_type == BindingType::TABLE);
		auto &table_binding = original_binding->Cast<TableBinding>();
		insert.columns_to_fetch = GetColumnsToFetch(table_binding);
		return;
	}

	D_ASSERT(on_conflict.set_info);
	auto &set_info = *on_conflict.set_info;
	D_ASSERT(set_info.columns.size() == set_info.expressions.size());

	if (set_info.condition) {
		WhereBinder where_binder(*this, context);

		// Avoid ambiguity between existing table columns and EXCLUDED columns.
		vector<unordered_set<string>> lambda_params;
		where_binder.DoUpdateSetQualify(set_info.condition, table_alias, lambda_params);

		// Bind the SET ... WHERE clause.
		auto condition = where_binder.Bind(set_info.condition);
		insert.do_update_condition = std::move(condition);
	}

	BindDoUpdateSetExpressions(table_alias, insert, set_info, table, storage_info);

	// Get the column_ids we need to fetch later on from the conflicting tuples
	// of the original table, to execute the expressions
	D_ASSERT(original_binding->binding_type == BindingType::TABLE);
	auto &table_binding = original_binding->Cast<TableBinding>();
	insert.columns_to_fetch = GetColumnsToFetch(table_binding);

	// Replace the column bindings to refer to the child operator
	for (auto &expr : insert.expressions) {
		// Change the non-excluded column references to refer to the projection index
		ReplaceColumnBindings(*expr, table_index, projection_index.GetIndex());
	}
	// Do the same for the (optional) DO UPDATE condition
	if (insert.do_update_condition) {
		ReplaceColumnBindings(*insert.do_update_condition, table_index, projection_index.GetIndex());
	}
}